

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_PackFontRanges
              (stbtt_pack_context *spc,uchar *fontdata,int font_index,stbtt_pack_range *ranges,
              int num_ranges)

{
  uint uVar1;
  stbrp_rect *rects;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined1 local_70 [8];
  stbtt_fontinfo info;
  
  uVar2 = 0;
  if (0 < num_ranges) {
    uVar2 = (ulong)(uint)num_ranges;
  }
  for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    uVar1 = ranges[uVar4].num_chars;
    if (ranges[uVar4].num_chars < 1) {
      uVar1 = 0;
    }
    for (lVar5 = 0; (ulong)uVar1 * 0x1c - lVar5 != 0; lVar5 = lVar5 + 0x1c) {
      *(undefined8 *)((long)&(ranges[uVar4].chardata_for_range)->x0 + lVar5) = 0;
    }
  }
  iVar3 = 0;
  for (lVar5 = 0; uVar2 * 0x28 - lVar5 != 0; lVar5 = lVar5 + 0x28) {
    iVar3 = iVar3 + *(int *)((long)&ranges->num_chars + lVar5);
  }
  info.indexToLocFormat = font_index;
  rects = (stbrp_rect *)malloc((long)iVar3 * 0x18);
  if (rects == (stbrp_rect *)0x0) {
    iVar3 = 0;
  }
  else {
    local_70 = (undefined1  [8])spc->user_allocator_context;
    iVar3 = stbtt_GetFontOffsetForIndex(fontdata,info.indexToLocFormat);
    stbtt_InitFont((stbtt_fontinfo *)local_70,fontdata,iVar3);
    iVar3 = stbtt_PackFontRangesGatherRects(spc,(stbtt_fontinfo *)local_70,ranges,num_ranges,rects);
    stbtt_PackFontRangesPackRects(spc,rects,iVar3);
    iVar3 = stbtt_PackFontRangesRenderIntoRects
                      (spc,(stbtt_fontinfo *)local_70,ranges,num_ranges,rects);
    free(rects);
  }
  return iVar3;
}

Assistant:

STBTT_DEF int stbtt_PackFontRanges(stbtt_pack_context *spc, unsigned char *fontdata, int font_index, stbtt_pack_range *ranges, int num_ranges)
{
   stbtt_fontinfo info;
   int i,j,n, return_value = 1;
   //stbrp_context *context = (stbrp_context *) spc->pack_info;
   stbrp_rect    *rects;

   // flag all characters as NOT packed
   for (i=0; i < num_ranges; ++i)
      for (j=0; j < ranges[i].num_chars; ++j)
         ranges[i].chardata_for_range[j].x0 =
         ranges[i].chardata_for_range[j].y0 =
         ranges[i].chardata_for_range[j].x1 =
         ranges[i].chardata_for_range[j].y1 = 0;

   n = 0;
   for (i=0; i < num_ranges; ++i)
      n += ranges[i].num_chars;
         
   rects = (stbrp_rect *) STBTT_malloc(sizeof(*rects) * n, spc->user_allocator_context);
   if (rects == NULL)
      return 0;

   info.userdata = spc->user_allocator_context;
   stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata,font_index));

   n = stbtt_PackFontRangesGatherRects(spc, &info, ranges, num_ranges, rects);

   stbtt_PackFontRangesPackRects(spc, rects, n);
  
   return_value = stbtt_PackFontRangesRenderIntoRects(spc, &info, ranges, num_ranges, rects);

   STBTT_free(rects, spc->user_allocator_context);
   return return_value;
}